

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hanabi_state.cc
# Opt level: O1

bool __thiscall hanabi_learning_env::HanabiState::MoveIsLegal(HanabiState *this,HanabiMove move)

{
  pointer pHVar1;
  pointer pHVar2;
  char cVar3;
  pointer pHVar5;
  ulong uVar6;
  pointer pHVar7;
  char cVar8;
  long lVar9;
  int iVar10;
  bool bVar11;
  uint uVar4;
  
  if (4 < move.move_type_ - kPlay) {
    return false;
  }
  cVar3 = move.target_offset_;
  uVar4 = move._4_4_ >> 8;
  cVar8 = move.rank_;
  switch(move.move_type_) {
  case kDiscard:
    if (this->parent_game_->max_information_tokens_ <= this->information_tokens_) {
      return false;
    }
  case kPlay:
    pHVar1 = (this->hands_).
             super__Vector_base<hanabi_learning_env::HanabiHand,_std::allocator<hanabi_learning_env::HanabiHand>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(long)move.card_index_ <
        (ulong)((long)*(pointer *)
                       ((long)&pHVar1[this->cur_player_].cards_.
                               super__Vector_base<hanabi_learning_env::HanabiCard,_std::allocator<hanabi_learning_env::HanabiCard>_>
                               ._M_impl + 8) -
                *(long *)&pHVar1[this->cur_player_].cards_.
                          super__Vector_base<hanabi_learning_env::HanabiCard,_std::allocator<hanabi_learning_env::HanabiCard>_>
                          ._M_impl >> 3)) {
      return true;
    }
    return false;
  case kRevealColor:
    if (cVar3 < '\x01') {
      return false;
    }
    if (this->information_tokens_ < 1) {
      return false;
    }
    if (this->parent_game_->num_players_ <= (int)(uVar4 & 0x7f)) {
      return false;
    }
    pHVar1 = (this->hands_).
             super__Vector_base<hanabi_learning_env::HanabiHand,_std::allocator<hanabi_learning_env::HanabiHand>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar6 = (ulong)((long)cVar3 + (long)this->cur_player_) %
            (ulong)(((long)(this->hands_).
                           super__Vector_base<hanabi_learning_env::HanabiHand,_std::allocator<hanabi_learning_env::HanabiHand>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)pHVar1 >> 4) *
                   -0x5555555555555555);
    pHVar7 = *(pointer *)
              &pHVar1[uVar6].cards_.
               super__Vector_base<hanabi_learning_env::HanabiCard,_std::allocator<hanabi_learning_env::HanabiCard>_>
               ._M_impl;
    pHVar2 = *(pointer *)
              ((long)&pHVar1[uVar6].cards_.
                      super__Vector_base<hanabi_learning_env::HanabiCard,_std::allocator<hanabi_learning_env::HanabiCard>_>
                      ._M_impl + 8);
    lVar9 = (long)pHVar2 - (long)pHVar7 >> 5;
    cVar8 = move.color_;
    pHVar5 = pHVar7;
    if (0 < lVar9) {
      iVar10 = (int)cVar8;
      pHVar5 = (pointer)((long)&pHVar7->color_ + ((long)pHVar2 - (long)pHVar7 & 0xffffffffffffffe0U)
                        );
      lVar9 = lVar9 + 1;
      pHVar7 = pHVar7 + 2;
      do {
        if (pHVar7[-2].color_ == iVar10) goto LAB_0010e38f;
        if (pHVar7[-1].color_ == iVar10) goto LAB_0010e395;
        if (pHVar7->color_ == iVar10) goto LAB_0010e39f;
        if (pHVar7[1].color_ == iVar10) goto LAB_0010e39b;
        lVar9 = lVar9 + -1;
        pHVar7 = pHVar7 + 4;
      } while (1 < lVar9);
    }
    lVar9 = (long)pHVar2 - (long)pHVar5 >> 3;
    if (lVar9 != 1) {
      if (lVar9 != 2) {
        pHVar7 = pHVar2;
        if ((lVar9 != 3) || (pHVar7 = pHVar5, pHVar5->color_ == (int)cVar8)) goto LAB_0010e39f;
        pHVar5 = pHVar5 + 1;
      }
      pHVar7 = pHVar5;
      if (pHVar5->color_ == (int)cVar8) goto LAB_0010e39f;
      pHVar5 = pHVar5 + 1;
    }
    bVar11 = pHVar5->color_ == (int)cVar8;
    break;
  case kRevealRank:
    if (cVar3 < '\x01') {
      return false;
    }
    if (this->information_tokens_ < 1) {
      return false;
    }
    if (this->parent_game_->num_players_ <= (int)(uVar4 & 0x7f)) {
      return false;
    }
    pHVar1 = (this->hands_).
             super__Vector_base<hanabi_learning_env::HanabiHand,_std::allocator<hanabi_learning_env::HanabiHand>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar6 = (ulong)((long)cVar3 + (long)this->cur_player_) %
            (ulong)(((long)(this->hands_).
                           super__Vector_base<hanabi_learning_env::HanabiHand,_std::allocator<hanabi_learning_env::HanabiHand>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)pHVar1 >> 4) *
                   -0x5555555555555555);
    pHVar7 = *(pointer *)
              &pHVar1[uVar6].cards_.
               super__Vector_base<hanabi_learning_env::HanabiCard,_std::allocator<hanabi_learning_env::HanabiCard>_>
               ._M_impl;
    pHVar2 = *(pointer *)
              ((long)&pHVar1[uVar6].cards_.
                      super__Vector_base<hanabi_learning_env::HanabiCard,_std::allocator<hanabi_learning_env::HanabiCard>_>
                      ._M_impl + 8);
    lVar9 = (long)pHVar2 - (long)pHVar7 >> 5;
    pHVar5 = pHVar7;
    if (0 < lVar9) {
      iVar10 = (int)cVar8;
      pHVar5 = (pointer)((long)&pHVar7->color_ + ((long)pHVar2 - (long)pHVar7 & 0xffffffffffffffe0U)
                        );
      lVar9 = lVar9 + 1;
      pHVar7 = pHVar7 + 2;
      do {
        if (pHVar7[-2].rank_ == iVar10) goto LAB_0010e38f;
        if (pHVar7[-1].rank_ == iVar10) goto LAB_0010e395;
        if (pHVar7->rank_ == iVar10) goto LAB_0010e39f;
        if (pHVar7[1].rank_ == iVar10) goto LAB_0010e39b;
        lVar9 = lVar9 + -1;
        pHVar7 = pHVar7 + 4;
      } while (1 < lVar9);
    }
    lVar9 = (long)pHVar2 - (long)pHVar5 >> 3;
    if (lVar9 != 1) {
      if (lVar9 != 2) {
        pHVar7 = pHVar2;
        if ((lVar9 != 3) || (pHVar7 = pHVar5, pHVar5->rank_ == (int)cVar8)) goto LAB_0010e39f;
        pHVar5 = pHVar5 + 1;
      }
      pHVar7 = pHVar5;
      if (pHVar5->rank_ == (int)cVar8) goto LAB_0010e39f;
      pHVar5 = pHVar5 + 1;
    }
    bVar11 = pHVar5->rank_ == (int)cVar8;
    break;
  case kDeal:
    if (this->cur_player_ != -1) {
      return false;
    }
    if ((this->deck_).card_count_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start
        [(move._3_4_ >> 0x18) * (this->deck_).num_ranks_ + (int)cVar8] != 0) {
      return true;
    }
    return false;
  }
  pHVar7 = pHVar5;
  if (!bVar11) {
    pHVar7 = pHVar2;
  }
LAB_0010e39f:
  if (pHVar7 != pHVar2) {
    return true;
  }
  return false;
LAB_0010e38f:
  pHVar7 = pHVar7 + -2;
  goto LAB_0010e39f;
LAB_0010e395:
  pHVar7 = pHVar7 + -1;
  goto LAB_0010e39f;
LAB_0010e39b:
  pHVar7 = pHVar7 + 1;
  goto LAB_0010e39f;
}

Assistant:

bool HanabiState::MoveIsLegal(HanabiMove move) const {
  switch (move.MoveType()) {
    case HanabiMove::kDeal:
      if (cur_player_ != kChancePlayerId) {
        return false;
      }
      if (deck_.CardCount(move.Color(), move.Rank()) == 0) {
        return false;
      }
      break;
    case HanabiMove::kDiscard:
      if (InformationTokens() >= ParentGame()->MaxInformationTokens()) {
        return false;
      }
      if (move.CardIndex() >= hands_[cur_player_].Cards().size()) {
        return false;
      }
      break;
    case HanabiMove::kPlay:
      if (move.CardIndex() >= hands_[cur_player_].Cards().size()) {
        return false;
      }
      break;
    case HanabiMove::kRevealColor: {
      if (!HintingIsLegal(move)) {
        return false;
      }
      const auto& cards = HandByOffset(move.TargetOffset()).Cards();
      if (!std::any_of(cards.begin(), cards.end(),
                       [move](const HanabiCard& card) {
                         return card.Color() == move.Color();
                       })) {
        return false;
      }
      break;
    }
    case HanabiMove::kRevealRank: {
      if (!HintingIsLegal(move)) {
        return false;
      }
      const auto& cards = HandByOffset(move.TargetOffset()).Cards();
      if (!std::any_of(cards.begin(), cards.end(),
                       [move](const HanabiCard& card) {
                         return card.Rank() == move.Rank();
                       })) {
        return false;
      }
      break;
    }
    default:
      return false;
  }
  return true;
}